

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *this;
  char *mode;
  char *pcVar2;
  bool local_202;
  bool local_1d2;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  PersistenceTest test;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  byte local_cb;
  byte local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  bool local_1a;
  bool local_19;
  bool testmode;
  char **ppcStack_18;
  bool verbose;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_19 = false;
  local_1a = false;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    pcVar2 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar2,&local_41);
    local_19 = std::operator==(&local_40,"-v");
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    pcVar2 = ppcStack_18[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar2,&local_79);
    local_1a = std::operator==(&local_78,"-t");
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else if (argc == 3) {
    pcVar2 = argv[1];
    std::allocator<char>::allocator();
    local_ca = 0;
    local_cb = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar2,&local_a1);
    bVar1 = std::operator==(&local_a0,"-v");
    local_1d2 = true;
    if (!bVar1) {
      pcVar2 = ppcStack_18[2];
      std::allocator<char>::allocator();
      local_ca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar2,&local_c9);
      local_cb = 1;
      local_1d2 = std::operator==(&local_c8,"-v");
    }
    local_19 = local_1d2;
    if ((local_cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if ((local_ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_c9);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pcVar2 = ppcStack_18[1];
    std::allocator<char>::allocator();
    test.TEST_MAX._6_1_ = 0;
    test.TEST_MAX._5_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar2,&local_f1);
    bVar1 = std::operator==(&local_f0,"-t");
    local_202 = true;
    if (!bVar1) {
      pcVar2 = ppcStack_18[2];
      std::allocator<char>::allocator();
      test.TEST_MAX._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,pcVar2,(allocator<char> *)((long)&test.TEST_MAX + 7));
      test.TEST_MAX._5_1_ = 1;
      local_202 = std::operator==(&local_118,"-t");
    }
    local_1a = local_202;
    if ((test.TEST_MAX._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((test.TEST_MAX._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&test.TEST_MAX + 7));
    }
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  else if (3 < argc) {
    this = std::operator<<((ostream *)&std::cerr,"Too many arguments.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    usage(*ppcStack_18,"OFF","Preparation Mode");
    exit(-1);
  }
  pcVar2 = "OFF";
  if ((local_19 & 1U) != 0) {
    pcVar2 = "ON";
  }
  mode = "Preparation Mode";
  if ((local_1a & 1U) != 0) {
    mode = "Test Mode";
  }
  usage(*ppcStack_18,pcVar2,mode);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"./data",&local_189);
  PersistenceTest::PersistenceTest((PersistenceTest *)local_168,&local_188,(bool)(local_19 & 1));
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  PersistenceTest::start_test((PersistenceTest *)local_168,&local_1a);
  argv_local._4_4_ = 0;
  PersistenceTest::~PersistenceTest((PersistenceTest *)local_168);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    bool verbose = false;
    bool testmode = false;

    if (argc == 2) {
        verbose = std::string(argv[1]) == "-v";
        testmode = std::string(argv[1]) == "-t";
    } else if (argc == 3) {
        verbose = std::string(argv[1]) == "-v" ||
                  std::string(argv[2]) == "-v";
        testmode = std::string(argv[1]) == "-t" ||
                   std::string(argv[2]) == "-t";
    } else if (argc > 3) {
        std::cerr << "Too many arguments." << std::endl;
        usage(argv[0], "OFF", "Preparation Mode");
        exit(-1);
    }
    usage(argv[0], verbose ? "ON" : "OFF",
          testmode ? "Test Mode" : "Preparation Mode");

    PersistenceTest test("./data", verbose);

    test.start_test(static_cast<void *>(&testmode));

    return 0;
}